

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall cbtCollisionWorld::performDiscreteCollisionDetection(cbtCollisionWorld *this)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  rep_conflict rVar3;
  undefined4 extraout_var;
  CProfileSample __profile_2;
  CProfileSample __profile_1;
  CProfileSample __profile;
  CProfileSample __ch_profile_1;
  CProfileSample __ch_profile;
  CProfileSample local_15;
  CProfileSample local_14;
  CProfileSample local_13;
  CProfileSample local_12;
  CProfileSample local_11;
  
  CProfileSample::CProfileSample(&local_13,"performDiscreteCollisionDetection");
  (*this->_vptr_cbtCollisionWorld[2])(this);
  CProfileSample::CProfileSample(&local_14,"computeOverlappingPairs");
  chrono::utils::ChProfileManager::Start_Profile("Broad-phase");
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_broad).m_start.__d.__r = rVar3;
  (*this->_vptr_cbtCollisionWorld[3])(this);
  chrono::ChTimer<double>::stop(&this->timer_collision_broad);
  chrono::utils::CProfileSample::~CProfileSample(&local_11);
  CProfileSample::~CProfileSample(&local_14);
  pcVar1 = this->m_dispatcher1;
  CProfileSample::CProfileSample(&local_15,"dispatchAllCollisionPairs");
  chrono::utils::ChProfileManager::Start_Profile("Narrow-phase");
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_collision_narrow).m_start.__d.__r = rVar3;
  if (pcVar1 != (cbtDispatcher *)0x0) {
    iVar2 = (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[9])();
    (*pcVar1->_vptr_cbtDispatcher[8])
              (pcVar1,CONCAT44(extraout_var,iVar2),&this->m_dispatchInfo,this->m_dispatcher1);
  }
  chrono::ChTimer<double>::stop(&this->timer_collision_narrow);
  chrono::utils::CProfileSample::~CProfileSample(&local_12);
  CProfileSample::~CProfileSample(&local_15);
  CProfileSample::~CProfileSample(&local_13);
  return;
}

Assistant:

void cbtCollisionWorld::performDiscreteCollisionDetection()
{
	BT_PROFILE("performDiscreteCollisionDetection");

	cbtDispatcherInfo& dispatchInfo = getDispatchInfo();

	updateAabbs();

	{
        /* ***CHRONO*** Add Chrono-specific timers */
		BT_PROFILE("computeOverlappingPairs");
        CH_PROFILE("Broad-phase");
        timer_collision_broad.start();
		computeOverlappingPairs();
        timer_collision_broad.stop();
	}

	cbtDispatcher* dispatcher = getDispatcher();
	{
        /* ***CHRONO*** Add Chrono-specific timers */
        BT_PROFILE("dispatchAllCollisionPairs");
		CH_PROFILE("Narrow-phase");
        timer_collision_narrow.start();
		if (dispatcher)
			dispatcher->dispatchAllCollisionPairs(m_broadphasePairCache->getOverlappingPairCache(), dispatchInfo, m_dispatcher1);
		timer_collision_narrow.stop();
	}
}